

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

bool __thiscall
rsg::anon_unknown_0::IsSamplerEntry::operator()(IsSamplerEntry *this,ValueEntry *entry)

{
  bool bVar1;
  Variable *this_00;
  VariableType *this_01;
  VariableType local_70;
  ValueEntry *local_20;
  ValueEntry *entry_local;
  IsSamplerEntry *this_local;
  
  local_20 = entry;
  entry_local = (ValueEntry *)this;
  this_00 = ValueEntry::getVariable(entry);
  this_01 = Variable::getType(this_00);
  VariableType::VariableType(&local_70,this->m_type,1);
  bVar1 = VariableType::operator==(this_01,&local_70);
  VariableType::~VariableType(&local_70);
  return bVar1;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		if (entry->getVariable()->getType() == VariableType(m_type, 1))
		{
			DE_ASSERT(entry->getVariable()->getStorage() == Variable::STORAGE_UNIFORM);
			return true;
		}
		else
			return false;
	}